

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O0

bool __thiscall squall::KlassTable::find_klass_object<Foo_const>(KlassTable *this,HSQOBJECT *obj)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  element_type *peVar4;
  SQTable *extraout_RDX;
  undefined4 uStack_64;
  undefined1 local_48 [8];
  shared_ptr<squall::detail::KlassImpBase> p;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
  local_30;
  iterator i;
  size_t h;
  HSQOBJECT *obj_local;
  KlassTable *this_local;
  
  i.
  super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
             )detail::KlassImp<Foo>::hash();
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
       ::find(&this->klasses_,(key_type *)&i);
  p.super___shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>_>
       ::end(&this->klasses_);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                      *)&p.
                         super___shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  if (!bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false,_false>
                          *)&local_30);
    std::shared_ptr<squall::detail::KlassImpBase>::shared_ptr
              ((shared_ptr<squall::detail::KlassImpBase> *)local_48,&ppVar3->second);
    peVar4 = std::
             __shared_ptr_access<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    (*peVar4->_vptr_KlassImpBase[2])();
    peVar4 = std::
             __shared_ptr_access<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    iVar2 = (*peVar4->_vptr_KlassImpBase[3])();
    *(ulong *)obj = CONCAT44(uStack_64,iVar2);
    (obj->_unVal).pTable = extraout_RDX;
    std::shared_ptr<squall::detail::KlassImpBase>::~shared_ptr
              ((shared_ptr<squall::detail::KlassImpBase> *)local_48);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool find_klass_object(HSQOBJECT& obj) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            return false;
        } else {
            auto p = (*i).second;
            p->close();
            obj = p->get_klass_object();
            return true;
        }
    }